

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O2

EStatusCode __thiscall
AbstractContentContext::DrawImage
          (AbstractContentContext *this,double inX,double inY,string *inImagePath,
          ImageOptions *inOptions)

{
  undefined1 auVar1 [16];
  int i;
  undefined4 extraout_EAX;
  int iVar2;
  long lVar3;
  undefined4 extraout_var;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  ObjectIDTypeAndBool OVar11;
  DoubleAndDoublePair DVar12;
  double local_78 [7];
  string local_40;
  
  local_78[1] = 0.0;
  local_78[2] = 0.0;
  local_78[4] = 0.0;
  local_78[5] = 0.0;
  local_78[0] = 1.0;
  local_78[3] = 1.0;
  if (inOptions->transformationMethod == eFit) {
    DVar12 = PDFHummus::DocumentContext::GetImageDimensions
                       (this->mDocumentContext,inImagePath,inOptions->imageIndex,
                        &inOptions->pdfParsingOptions);
    auVar7._0_8_ = inOptions->boundingBoxWidth;
    auVar7._8_8_ = inOptions->boundingBoxHeight;
    if (inOptions->fitPolicy == eAlways) {
      auVar9 = divpd(auVar7,(undefined1  [16])DVar12);
    }
    else {
      uVar4 = -(ulong)((double)auVar7._0_8_ < DVar12.first);
      uVar5 = -(ulong)((double)auVar7._8_8_ < DVar12.second);
      auVar9._8_8_ = uVar5;
      auVar9._0_8_ = uVar4;
      iVar2 = movmskpd(extraout_EAX,auVar9);
      auVar9 = _DAT_0029b500;
      if (iVar2 != 0) {
        auVar7 = divpd(auVar7,(undefined1  [16])DVar12);
        auVar8._0_8_ = auVar7._0_8_ & uVar4;
        auVar8._8_8_ = auVar7._8_8_ & uVar5;
        auVar1._8_8_ = ~uVar5 & 0x3ff0000000000000;
        auVar1._0_8_ = ~uVar4 & 0x3ff0000000000000;
        auVar9 = auVar8 | auVar1;
      }
    }
    local_78[3] = auVar9._8_8_;
    dVar10 = auVar9._0_8_;
    local_78[0] = dVar10;
    if ((inOptions->fitProportional != false) && (local_78[0] = local_78[3], dVar10 <= local_78[3]))
    {
      local_78[0] = dVar10;
      local_78[3] = dVar10;
    }
    dVar10 = 0.0;
    dVar6 = 0.0;
  }
  else {
    dVar10 = 0.0;
    dVar6 = 0.0;
    if (inOptions->transformationMethod == eMatrix) {
      for (lVar3 = 0; dVar10 = local_78[5], dVar6 = local_78[4], lVar3 != 6; lVar3 = lVar3 + 1) {
        local_78[lVar3] = inOptions->matrix[lVar3];
      }
    }
  }
  OVar11 = PDFHummus::DocumentContext::RegisterImageForDrawing
                     (this->mDocumentContext,inImagePath,inOptions->imageIndex);
  if (((undefined1  [16])OVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    (*this->_vptr_AbstractContentContext[3])
              (this,inImagePath,inOptions->imageIndex,OVar11.first,&inOptions->pdfParsingOptions);
  }
  q(this);
  cm(this,local_78[0],local_78[1],local_78[2],local_78[3],dVar6 + inX,dVar10 + inY);
  iVar2 = (*this->_vptr_AbstractContentContext[2])(this);
  ResourcesDictionary::AddFormXObjectMapping_abi_cxx11_
            (&local_40,(ResourcesDictionary *)CONCAT44(extraout_var,iVar2),OVar11.first);
  Do(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  Q(this);
  return this->mCurrentStatusCode;
}

Assistant:

EStatusCode AbstractContentContext::DrawImage(double inX,double inY,const std::string& inImagePath,const ImageOptions& inOptions)
{
	double transformation[6] = {1,0,0,1,0,0};

	if(inOptions.transformationMethod == eMatrix)
	{
		for(int i=0;i<6;++i)
			transformation[i] = inOptions.matrix[i];
	}
	else if(inOptions.transformationMethod == eFit)
	{
		DoubleAndDoublePair imageDimensions = mDocumentContext->GetImageDimensions(inImagePath,inOptions.imageIndex,inOptions.pdfParsingOptions);

        double scaleX = 1;
        double scaleY = 1;
                    
        if(inOptions.fitPolicy == eAlways)
        {
            scaleX = inOptions.boundingBoxWidth / imageDimensions.first;
            scaleY = inOptions.boundingBoxHeight / imageDimensions.second;
                        

        }
        else if(imageDimensions.first > inOptions.boundingBoxWidth || imageDimensions.second > inOptions.boundingBoxHeight) // overflow
        {
            scaleX = imageDimensions.first > inOptions.boundingBoxWidth ? inOptions.boundingBoxWidth / imageDimensions.first : 1;
            scaleY = imageDimensions.second > inOptions.boundingBoxHeight ? inOptions.boundingBoxHeight / imageDimensions.second : 1;
        }
                    
        if(inOptions.fitProportional)
        {
            scaleX = std::min(scaleX,scaleY);
            scaleY = scaleX;
        }
                    
        transformation[0] = scaleX;
        transformation[3] = scaleY;
	}

	transformation[4]+=inX;
	transformation[5]+=inY;

    // registering the images at pdfwriter to allow optimization on image writes
    ObjectIDTypeAndBool result = mDocumentContext->RegisterImageForDrawing(inImagePath,inOptions.imageIndex);
    if(result.second)
    {
        // if first usage, write the image
        ScheduleImageWrite(inImagePath,inOptions.imageIndex,result.first,inOptions.pdfParsingOptions);
    }
    
    q();
    cm(transformation[0],transformation[1],transformation[2],transformation[3],transformation[4],transformation[5]);
    Do(GetResourcesDictionary()->AddFormXObjectMapping(result.first));
    Q();
	return GetCurrentStatusCode();

}